

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O1

void uv__chld(uv_signal_t *handle,int signum)

{
  uint uVar1;
  long ******pppppplVar2;
  long ******pppppplVar3;
  long ******pppppplVar4;
  __pid_t _Var5;
  int *piVar6;
  uint uVar7;
  long ******pppppplVar8;
  void *(*papvVar9) [2];
  int status;
  QUEUE pending;
  int local_4c;
  long *****local_48;
  long *****local_40;
  
  if (signum != 0x11) {
    __assert_fail("signum == SIGCHLD","src/unix/process.c",0x3e,"void uv__chld(uv_signal_t *, int)")
    ;
  }
  pppppplVar8 = (long ******)handle->loop->process_handles[0][0];
  papvVar9 = handle->loop->process_handles;
  pppppplVar3 = &local_48;
  pppppplVar4 = &local_48;
  if ((void *(*) [2])pppppplVar8 != papvVar9) {
    local_48 = (long *****)&local_48;
    local_40 = (long *****)&local_48;
    do {
      pppppplVar2 = (long ******)*pppppplVar8;
      do {
        _Var5 = waitpid(*(__pid_t *)(pppppplVar8 + -1),&local_4c,1);
        if (_Var5 != -1) break;
        piVar6 = __errno_location();
      } while (*piVar6 == 4);
      if (_Var5 != 0) {
        if (_Var5 == -1) {
          piVar6 = __errno_location();
          if (*piVar6 != 10) {
            abort();
          }
        }
        else {
          *(int *)(pppppplVar8 + 2) = local_4c;
          *pppppplVar8[1] = (long ****)*pppppplVar8;
          (*pppppplVar8)[1] = (long ****)pppppplVar8[1];
          *pppppplVar8 = (long *****)&local_48;
          pppppplVar8[1] = local_40;
          *local_40 = (long ****)pppppplVar8;
          local_40 = (long *****)pppppplVar8;
        }
      }
      pppppplVar8 = pppppplVar2;
      pppppplVar3 = (long ******)local_48;
      pppppplVar4 = (long ******)local_40;
    } while ((void *(*) [2])pppppplVar2 != papvVar9);
  }
  while (&local_48 != pppppplVar3) {
    *pppppplVar3[1] = (long ****)*pppppplVar3;
    (*pppppplVar3)[1] = (long ****)pppppplVar3[1];
    *pppppplVar3 = (long *****)pppppplVar3;
    pppppplVar3[1] = (long *****)pppppplVar3;
    uVar1 = *(uint *)(pppppplVar3 + -4);
    if (((uVar1 >> 0xe & 1) != 0) &&
       (*(uint *)(pppppplVar3 + -4) = uVar1 & 0xffffbfff, (uVar1 >> 0xd & 1) != 0)) {
      *(int *)(pppppplVar3[-8] + 1) = *(int *)(pppppplVar3[-8] + 1) + -1;
    }
    if (pppppplVar3[-2] != (long *****)0x0) {
      uVar7 = *(uint *)(pppppplVar3 + 2) & 0x7f;
      uVar1 = *(uint *)(pppppplVar3 + 2) >> 8 & 0xff;
      if (uVar7 != 0) {
        uVar1 = 0;
      }
      if ((int)(uVar7 * 0x1000000 + 0x1000000) < 0x2000000) {
        uVar7 = 0;
      }
      local_48 = (long *****)pppppplVar3;
      local_40 = (long *****)pppppplVar4;
      (*(code *)pppppplVar3[-2])(pppppplVar3 + -10,uVar1,uVar7);
      pppppplVar3 = (long ******)local_48;
      pppppplVar4 = (long ******)local_40;
    }
  }
  return;
}

Assistant:

static void uv__chld(uv_signal_t* handle, int signum) {
  uv_process_t* process;
  uv_loop_t* loop;
  int exit_status;
  int term_signal;
  unsigned int i;
  int status;
  pid_t pid;
  QUEUE pending;
  QUEUE* h;
  QUEUE* q;

  assert(signum == SIGCHLD);

  QUEUE_INIT(&pending);
  loop = handle->loop;

  for (i = 0; i < ARRAY_SIZE(loop->process_handles); i++) {
    h = loop->process_handles + i;
    q = QUEUE_HEAD(h);

    while (q != h) {
      process = QUEUE_DATA(q, uv_process_t, queue);
      q = QUEUE_NEXT(q);

      do
        pid = waitpid(process->pid, &status, WNOHANG);
      while (pid == -1 && errno == EINTR);

      if (pid == 0)
        continue;

      if (pid == -1) {
        if (errno != ECHILD)
          abort();
        continue;
      }

      process->status = status;
      QUEUE_REMOVE(&process->queue);
      QUEUE_INSERT_TAIL(&pending, &process->queue);
    }

    while (!QUEUE_EMPTY(&pending)) {
      q = QUEUE_HEAD(&pending);
      QUEUE_REMOVE(q);
      QUEUE_INIT(q);

      process = QUEUE_DATA(q, uv_process_t, queue);
      uv__handle_stop(process);

      if (process->exit_cb == NULL)
        continue;

      exit_status = 0;
      if (WIFEXITED(process->status))
        exit_status = WEXITSTATUS(process->status);

      term_signal = 0;
      if (WIFSIGNALED(process->status))
        term_signal = WTERMSIG(process->status);

      process->exit_cb(process, exit_status, term_signal);
    }
  }
}